

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerListener
          (RegistryHub *this,unique_ptr<Catch::EventListenerFactory> *factory)

{
  unique_ptr<Catch::EventListenerFactory> local_10;
  
  local_10 = (unique_ptr<Catch::EventListenerFactory>)factory->m_ptr;
  factory->m_ptr = (EventListenerFactory *)0x0;
  ReporterRegistry::registerListener(&this->m_reporterRegistry,&local_10);
  if (local_10.m_ptr != (EventListenerFactory *)0x0) {
    (*(local_10.m_ptr)->_vptr_EventListenerFactory[1])();
  }
  return;
}

Assistant:

void registerListener( Detail::unique_ptr<EventListenerFactory> factory ) override {
                m_reporterRegistry.registerListener( CATCH_MOVE(factory) );
            }